

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::check(Option *this,Validator *validator,string *validator_name)

{
  ulong uVar1;
  reference this_00;
  string *in_RDX;
  Validator *in_RSI;
  Option *in_RDI;
  value_type *in_stack_ffffffffffffff88;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *in_stack_ffffffffffffff90;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  Validator::non_modifying(in_RSI,true);
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::push_back
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::back
                        (in_stack_ffffffffffffff90);
    ::std::__cxx11::string::string(local_38,local_18);
    Validator::name(this_00,(string *)in_stack_ffffffffffffff88);
    ::std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE Option *Option::check(Validator validator, const std::string &validator_name) {
    validator.non_modifying();
    validators_.push_back(std::move(validator));
    if(!validator_name.empty())
        validators_.back().name(validator_name);
    return this;
}